

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LU.hpp
# Opt level: O3

void OpenMD::LUSolveLinearSystem<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,int *index,ElemPoinerType x,int size)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ElemPoinerType pdVar6;
  double (*padVar7) [6];
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  if (0 < size) {
    uVar2 = (ulong)(uint)size;
    uVar4 = 0xffffffff;
    uVar5 = 0;
    padVar7 = (double (*) [6])A;
    do {
      dVar10 = x[index[uVar5]];
      x[index[uVar5]] = x[uVar5];
      if ((int)uVar4 < 0) {
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          uVar4 = (uint)uVar5;
        }
      }
      else {
        uVar9 = (ulong)uVar4;
        if (uVar9 < uVar5) {
          do {
            dVar10 = dVar10 - ((RectMatrix<double,_6U,_6U> *)*padVar7)->data_[0][uVar9] * x[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
        }
      }
      x[uVar5] = dVar10;
      uVar5 = uVar5 + 1;
      padVar7 = padVar7 + 1;
    } while (uVar5 != uVar2);
    if (0 < size) {
      lVar3 = (long)(A->super_RectMatrix<double,_6U,_6U>).data_ + uVar2 * 0x38 + -0x30;
      pdVar6 = x + uVar2;
      uVar5 = uVar2;
      do {
        dVar10 = x[uVar5 - 1];
        if ((long)uVar5 < (long)uVar2) {
          lVar8 = 0;
          do {
            dVar10 = dVar10 - *(double *)(lVar3 + lVar8 * 8) * pdVar6[lVar8];
            lVar8 = lVar8 + 1;
          } while ((int)uVar5 + (int)lVar8 < size);
        }
        x[uVar5 - 1] = dVar10 / *(double *)
                                 ((long)(A->super_RectMatrix<double,_6U,_6U>).data_ +
                                 uVar5 * 0x38 + -0x38);
        lVar3 = lVar3 + -0x38;
        pdVar6 = pdVar6 + -1;
        bVar1 = 1 < (long)uVar5;
        uVar5 = uVar5 - 1;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void LUSolveLinearSystem(MatrixType& A, int* index,
                           typename MatrixType::ElemPoinerType x, int size) {
    using Real = typename MatrixType::ElemType;

    int i, j, ii, idx;
    Real sum;
    //
    // Proceed with forward and backsubstitution for L and U
    // matrices.  First, forward substitution.
    //
    for (ii = -1, i = 0; i < size; ++i) {
      idx    = index[i];
      sum    = x[idx];
      x[idx] = x[i];

      if (ii >= 0) {
        for (j = ii; j <= (i - 1); ++j) {
          sum -= A(i, j) * x[j];
        }
      } else if (sum != 0.0) {
        ii = i;
      }

      x[i] = sum;
    }
    //
    // Now, back substitution
    //
    for (i = size - 1; i >= 0; i--) {
      sum = x[i];
      for (j = i + 1; j < size; ++j) {
        sum -= A(i, j) * x[j];
      }
      x[i] = sum / A(i, i);
    }
  }